

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slapack_lite.c
# Opt level: O2

int spotrf_(char *uplo,integer *n,real *a,integer *lda,integer *info)

{
  real *prVar1;
  logical lVar2;
  int iVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *opts;
  int iVar4;
  integer *in_R9;
  ftnlen in_stack_ffffffffffffff88;
  int local_64;
  integer i__4;
  int local_5c;
  ulong local_58;
  real *local_50;
  integer local_48;
  int local_44;
  real *local_40;
  int local_34;
  
  local_58 = (ulong)*lda;
  *info = 0;
  spotrf_::upper = lsame_(uplo,"U");
  opts = extraout_RDX;
  if ((spotrf_::upper == 0) && (lVar2 = lsame_(uplo,"L"), opts = extraout_RDX_00, lVar2 == 0)) {
    local_34 = -1;
  }
  else {
    iVar3 = *n;
    if (iVar3 < 0) {
      local_34 = -2;
    }
    else {
      if ((int)(iVar3 + (uint)(iVar3 == 0)) <= *lda) {
        local_34 = *info;
        if (local_34 == 0) {
          if (iVar3 == 0) {
            return 0;
          }
          spotrf_::nb = ilaenv_(&c__1,"SPOTRF",opts,n,&c_n1,in_R9,&c_n1,6,in_stack_ffffffffffffff88)
          ;
          if ((1 < spotrf_::nb) && (local_44 = *n, spotrf_::nb < local_44)) {
            local_50 = a + ~local_58;
            local_48 = spotrf_::nb;
            if (spotrf_::upper == 0) {
              local_5c = (int)local_58 + 1;
              spotrf_::j = 1;
              while( true ) {
                prVar1 = local_50;
                iVar3 = local_5c;
                if (local_44 < spotrf_::j) {
                  return 0;
                }
                i__4 = (*n - spotrf_::j) + 1;
                spotrf_::jb = i__4;
                if (spotrf_::nb < i__4) {
                  spotrf_::jb = spotrf_::nb;
                }
                local_64 = spotrf_::j + -1;
                ssyrk_("Lower","No transpose",&spotrf_::jb,&local_64,&c_b181,
                       local_50 + ((int)local_58 + spotrf_::j),lda,&c_b164,
                       local_50 + spotrf_::j * local_5c,lda);
                spotf2_("Lower",&spotrf_::jb,prVar1 + spotrf_::j * iVar3,lda,info);
                prVar1 = local_50;
                iVar3 = *info;
                if (iVar3 != 0) break;
                iVar3 = spotrf_::jb + spotrf_::j;
                if (iVar3 <= *n) {
                  local_64 = (*n - iVar3) + 1;
                  i__4 = spotrf_::j + -1;
                  iVar4 = (int)local_58;
                  sgemm_("No transpose","Transpose",&local_64,&spotrf_::jb,&i__4,&c_b181,
                         local_50 + (iVar3 + iVar4),lda,local_50 + (spotrf_::j + iVar4),lda,&c_b164,
                         local_50 + (spotrf_::j * iVar4 + iVar3),lda);
                  local_64 = (*n - (spotrf_::jb + spotrf_::j)) + 1;
                  strsm_("Right","Lower","Transpose","Non-unit",&local_64,&spotrf_::jb,&c_b164,
                         prVar1 + (spotrf_::j + spotrf_::j * iVar4),lda,
                         prVar1 + (spotrf_::j * iVar4 + spotrf_::jb + spotrf_::j),lda);
                }
                spotrf_::j = spotrf_::j + local_48;
              }
            }
            else {
              local_40 = local_50 + 1;
              local_5c = (int)local_58 + 1;
              spotrf_::j = 1;
              while( true ) {
                prVar1 = local_50;
                if (local_44 < spotrf_::j) {
                  return 0;
                }
                i__4 = (*n - spotrf_::j) + 1;
                spotrf_::jb = i__4;
                if (spotrf_::nb < i__4) {
                  spotrf_::jb = spotrf_::nb;
                }
                local_64 = spotrf_::j + -1;
                ssyrk_("Upper","Transpose",&spotrf_::jb,&local_64,&c_b181,
                       local_40 + spotrf_::j * (int)local_58,lda,&c_b164,
                       local_50 + (spotrf_::j * (int)local_58 + spotrf_::j),lda);
                spotf2_("Upper",&spotrf_::jb,prVar1 + spotrf_::j * local_5c,lda,info);
                prVar1 = local_50;
                iVar3 = *info;
                if (iVar3 != 0) break;
                iVar3 = spotrf_::jb + spotrf_::j;
                if (iVar3 <= *n) {
                  local_64 = (*n - iVar3) + 1;
                  i__4 = spotrf_::j + -1;
                  iVar4 = (int)local_58;
                  sgemm_("Transpose","No transpose",&spotrf_::jb,&local_64,&i__4,&c_b181,
                         local_40 + spotrf_::j * iVar4,lda,local_40 + iVar3 * iVar4,lda,&c_b164,
                         local_50 + (iVar3 * iVar4 + spotrf_::j),lda);
                  local_64 = (*n - (spotrf_::jb + spotrf_::j)) + 1;
                  strsm_("Left","Upper","Transpose","Non-unit",&spotrf_::jb,&local_64,&c_b164,
                         prVar1 + spotrf_::j * local_5c,lda,
                         prVar1 + ((spotrf_::jb + spotrf_::j) * iVar4 + spotrf_::j),lda);
                }
                spotrf_::j = spotrf_::j + local_48;
              }
            }
            *info = iVar3 + spotrf_::j + -1;
            return 0;
          }
          spotf2_(uplo,n,a,lda,info);
          return 0;
        }
        goto LAB_0010c932;
      }
      local_34 = -4;
    }
  }
  *info = local_34;
LAB_0010c932:
  local_34 = -local_34;
  xerbla_("SPOTRF",&local_34);
  return 0;
}

Assistant:

int spotrf_(char *uplo, integer *n, real *a, integer *lda,
	integer *info)
{
    /* System generated locals */
    integer a_dim1, a_offset, i__1, i__2, i__3, i__4;

    /* Local variables */
    static integer j, jb, nb;
    extern logical lsame_(char *, char *);
    extern /* Subroutine */ int sgemm_(char *, char *, integer *, integer *,
	    integer *, real *, real *, integer *, real *, integer *, real *,
	    real *, integer *);
    static logical upper;
    extern /* Subroutine */ int strsm_(char *, char *, char *, char *,
	    integer *, integer *, real *, real *, integer *, real *, integer *
	    ), ssyrk_(char *, char *, integer
	    *, integer *, real *, real *, integer *, real *, real *, integer *
	    ), spotf2_(char *, integer *, real *, integer *,
	    integer *), xerbla_(char *, integer *);
    extern integer ilaenv_(integer *, char *, char *, integer *, integer *,
	    integer *, integer *, ftnlen, ftnlen);


/*
    -- LAPACK routine (version 3.0) --
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,
       Courant Institute, Argonne National Lab, and Rice University
       March 31, 1993


    Purpose
    =======

    SPOTRF computes the Cholesky factorization of a real symmetric
    positive definite matrix A.

    The factorization has the form
       A = U**T * U,  if UPLO = 'U', or
       A = L  * L**T,  if UPLO = 'L',
    where U is an upper triangular matrix and L is lower triangular.

    This is the block version of the algorithm, calling Level 3 BLAS.

    Arguments
    =========

    UPLO    (input) CHARACTER*1
            = 'U':  Upper triangle of A is stored;
            = 'L':  Lower triangle of A is stored.

    N       (input) INTEGER
            The order of the matrix A.  N >= 0.

    A       (input/output) REAL array, dimension (LDA,N)
            On entry, the symmetric matrix A.  If UPLO = 'U', the leading
            N-by-N upper triangular part of A contains the upper
            triangular part of the matrix A, and the strictly lower
            triangular part of A is not referenced.  If UPLO = 'L', the
            leading N-by-N lower triangular part of A contains the lower
            triangular part of the matrix A, and the strictly upper
            triangular part of A is not referenced.

            On exit, if INFO = 0, the factor U or L from the Cholesky
            factorization A = U**T*U or A = L*L**T.

    LDA     (input) INTEGER
            The leading dimension of the array A.  LDA >= max(1,N).

    INFO    (output) INTEGER
            = 0:  successful exit
            < 0:  if INFO = -i, the i-th argument had an illegal value
            > 0:  if INFO = i, the leading minor of order i is not
                  positive definite, and the factorization could not be
                  completed.

    =====================================================================


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;

    /* Function Body */
    *info = 0;
    upper = lsame_(uplo, "U");
    if (! upper && ! lsame_(uplo, "L")) {
	*info = -1;
    } else if (*n < 0) {
	*info = -2;
    } else if (*lda < max(1,*n)) {
	*info = -4;
    }
    if (*info != 0) {
	i__1 = -(*info);
	xerbla_("SPOTRF", &i__1);
	return 0;
    }

/*     Quick return if possible */

    if (*n == 0) {
	return 0;
    }

/*     Determine the block size for this environment. */

    nb = ilaenv_(&c__1, "SPOTRF", uplo, n, &c_n1, &c_n1, &c_n1, (ftnlen)6, (
	    ftnlen)1);
    if (nb <= 1 || nb >= *n) {

/*        Use unblocked code. */

	spotf2_(uplo, n, &a[a_offset], lda, info);
    } else {

/*        Use blocked code. */

	if (upper) {

/*           Compute the Cholesky factorization A = U'*U. */

	    i__1 = *n;
	    i__2 = nb;
	    for (j = 1; i__2 < 0 ? j >= i__1 : j <= i__1; j += i__2) {

/*
                Update and factorize the current diagonal block and test
                for non-positive-definiteness.

   Computing MIN
*/
		i__3 = nb, i__4 = *n - j + 1;
		jb = min(i__3,i__4);
		i__3 = j - 1;
		ssyrk_("Upper", "Transpose", &jb, &i__3, &c_b181, &a[j *
			a_dim1 + 1], lda, &c_b164, &a[j + j * a_dim1], lda);
		spotf2_("Upper", &jb, &a[j + j * a_dim1], lda, info);
		if (*info != 0) {
		    goto L30;
		}
		if (j + jb <= *n) {

/*                 Compute the current block row. */

		    i__3 = *n - j - jb + 1;
		    i__4 = j - 1;
		    sgemm_("Transpose", "No transpose", &jb, &i__3, &i__4, &
			    c_b181, &a[j * a_dim1 + 1], lda, &a[(j + jb) *
			    a_dim1 + 1], lda, &c_b164, &a[j + (j + jb) *
			    a_dim1], lda);
		    i__3 = *n - j - jb + 1;
		    strsm_("Left", "Upper", "Transpose", "Non-unit", &jb, &
			    i__3, &c_b164, &a[j + j * a_dim1], lda, &a[j + (j
			    + jb) * a_dim1], lda);
		}
/* L10: */
	    }

	} else {

/*           Compute the Cholesky factorization A = L*L'. */

	    i__2 = *n;
	    i__1 = nb;
	    for (j = 1; i__1 < 0 ? j >= i__2 : j <= i__2; j += i__1) {

/*
                Update and factorize the current diagonal block and test
                for non-positive-definiteness.

   Computing MIN
*/
		i__3 = nb, i__4 = *n - j + 1;
		jb = min(i__3,i__4);
		i__3 = j - 1;
		ssyrk_("Lower", "No transpose", &jb, &i__3, &c_b181, &a[j +
			a_dim1], lda, &c_b164, &a[j + j * a_dim1], lda);
		spotf2_("Lower", &jb, &a[j + j * a_dim1], lda, info);
		if (*info != 0) {
		    goto L30;
		}
		if (j + jb <= *n) {

/*                 Compute the current block column. */

		    i__3 = *n - j - jb + 1;
		    i__4 = j - 1;
		    sgemm_("No transpose", "Transpose", &i__3, &jb, &i__4, &
			    c_b181, &a[j + jb + a_dim1], lda, &a[j + a_dim1],
			    lda, &c_b164, &a[j + jb + j * a_dim1], lda);
		    i__3 = *n - j - jb + 1;
		    strsm_("Right", "Lower", "Transpose", "Non-unit", &i__3, &
			    jb, &c_b164, &a[j + j * a_dim1], lda, &a[j + jb +
			    j * a_dim1], lda);
		}
/* L20: */
	    }
	}
    }
    goto L40;

L30:
    *info = *info + j - 1;

L40:
    return 0;

/*     End of SPOTRF */

}